

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::FieldMaskUtil::GetFieldDescriptors
          (FieldMaskUtil *this,Descriptor *descriptor,StringPiece path,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *field_descriptors)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator __position;
  bool bVar2;
  FieldDescriptor *pFVar3;
  ulong uVar4;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *this_00;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  FieldDescriptor *local_80;
  string local_78;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  FieldDescriptor *local_38;
  FieldDescriptor *field;
  
  this_00 = (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
             *)path.length_;
  if ((this_00 !=
       (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        *)0x0) && (*(long *)(this_00 + 8) != *(long *)this_00)) {
    *(long *)(this_00 + 8) = *(long *)this_00;
  }
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  if (descriptor == (Descriptor *)0x0) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,descriptor,path.ptr_ + (long)descriptor);
  }
  auStack_58 = (undefined1  [8])0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SplitStringUsing(&local_78,".",
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar7 = (undefined1  [8])
          parts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == auStack_58;
  if (this != (FieldMaskUtil *)0x0 && !bVar7) {
    lVar5 = 0;
    uVar6 = 1;
    do {
      local_38 = Descriptor::FindFieldByName
                           ((Descriptor *)this,
                            (string *)((long)&((_Alloc_hider *)auStack_58)->_M_p + lVar5));
      if (local_38 == (FieldDescriptor *)0x0) {
        bVar7 = false;
        break;
      }
      if (this_00 !=
          (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
           *)0x0) {
        __position._M_current = *(FieldDescriptor ***)(this_00 + 8);
        if (__position._M_current == *(FieldDescriptor ***)(this_00 + 0x10)) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    (this_00,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      pFVar3 = local_38;
      if (*(int *)(local_38 + 0x3c) == 3) {
LAB_002fed4c:
        this = (FieldMaskUtil *)0x0;
      }
      else {
        if (*(once_flag **)(local_38 + 0x30) != (once_flag *)0x0) {
          local_78._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_80 = local_38;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(local_38 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_78,
                     &local_80);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar3 + 0x38) * 4) != 10
           ) goto LAB_002fed4c;
        this = (FieldMaskUtil *)FieldDescriptor::message_type(local_38);
      }
      uVar4 = (long)parts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 5;
      bVar7 = uVar4 <= uVar6;
      if (this == (FieldMaskUtil *)0x0) break;
      lVar5 = lVar5 + 0x20;
      bVar2 = uVar6 < uVar4;
      uVar6 = uVar6 + 1;
    } while (bVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_58);
  return bVar7;
}

Assistant:

bool FieldMaskUtil::GetFieldDescriptors(
    const Descriptor* descriptor, StringPiece path,
    std::vector<const FieldDescriptor*>* field_descriptors) {
  if (field_descriptors != nullptr) {
    field_descriptors->clear();
  }
  std::vector<std::string> parts = Split(path, ".");
  for (int i = 0; i < parts.size(); ++i) {
    const std::string& field_name = parts[i];
    if (descriptor == nullptr) {
      return false;
    }
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == nullptr) {
      return false;
    }
    if (field_descriptors != nullptr) {
      field_descriptors->push_back(field);
    }
    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      descriptor = field->message_type();
    } else {
      descriptor = nullptr;
    }
  }
  return true;
}